

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

telnet_t *
telnet_init(telnet_telopt_t *telopts,telnet_event_handler_t eh,uchar flags,void *user_data)

{
  telnet_t *telnet;
  void *user_data_local;
  uchar flags_local;
  telnet_event_handler_t eh_local;
  telnet_telopt_t *telopts_local;
  
  telopts_local = (telnet_telopt_t *)calloc(1,0x50);
  if (telopts_local == (telnet_telopt_t *)0x0) {
    telopts_local = (telnet_telopt_t *)0x0;
  }
  else {
    *(void **)telopts_local = user_data;
    *(telnet_telopt_t **)(telopts_local + 2) = telopts;
    *(telnet_event_handler_t *)(telopts_local + 4) = eh;
    *(uchar *)&telopts_local[0x11].telopt = flags;
  }
  return (telnet_t *)telopts_local;
}

Assistant:

telnet_t *telnet_init(const telnet_telopt_t *telopts,
		telnet_event_handler_t eh, unsigned char flags, void *user_data) {
	/* allocate structure */
	struct telnet_t *telnet = (telnet_t*)calloc(1, sizeof(telnet_t));
	if (telnet == 0)
		return 0;

	/* initialize data */
	telnet->ud = user_data;
	telnet->telopts = telopts;
	telnet->eh = eh;
	telnet->flags = flags;

	return telnet;
}